

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncQueue.h
# Opt level: O0

void __thiscall
nrg::detail::AsyncQueue<nrg::PrioExecution>::operator()
          (AsyncQueue<nrg::PrioExecution> *this,_func_void_AsyncResult<int> *param,
          AsyncResult<int> *param_2)

{
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> lock;
  AsyncResult<int> *param_local_1;
  _func_void_AsyncResult<int> *param_local;
  AsyncQueue<nrg::PrioExecution> *this_local;
  
  lock._M_device = (mutex_type *)param_2;
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->guard_);
  PrioExecution::push<void(*)(nrg::AsyncResult<int>),nrg::AsyncResult<int>&>
            (&this->queue_,param,(AsyncResult<int> *)lock._M_device);
  std::condition_variable::notify_one();
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void operator()(Param&&... param)
    {
        std::lock_guard<std::mutex> lock(guard_);
        AsyncStyle::push(queue_, std::forward<Param>(param)...);
        cond_.notify_one();
    }